

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_rule.h
# Opt level: O0

void __thiscall
re2c::RuleOp::RuleOp(RuleOp *this,Loc *l,RegExp *r1,RegExp *r2,rule_rank_t r,Code *c,string *cond)

{
  allocator<char> local_45 [13];
  Code *local_38;
  Code *c_local;
  RegExp *r2_local;
  RegExp *r1_local;
  Loc *l_local;
  RuleOp *this_local;
  rule_rank_t r_local;
  
  local_38 = c;
  c_local = (Code *)r2;
  r2_local = r1;
  r1_local = (RegExp *)l;
  l_local = (Loc *)this;
  this_local._4_4_ = r.value;
  RegExp::RegExp(&this->super_RegExp);
  (this->super_RegExp)._vptr_RegExp = (_func_int **)&PTR__RuleOp_00210ce0;
  Loc::Loc(&this->loc,(Loc *)r1_local);
  this->exp = r2_local;
  this->ctx = (RegExp *)c_local;
  (this->rank).value = this_local._4_4_;
  this->code = local_38;
  if (cond == (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&this->newcond,"",local_45);
    std::allocator<char>::~allocator(local_45);
  }
  else {
    std::__cxx11::string::string((string *)&this->newcond,(string *)cond);
  }
  return;
}

Assistant:

inline RuleOp
		( const Loc & l
		, RegExp * r1
		, RegExp * r2
		, rule_rank_t r
		, const Code * c
		, const std::string * cond
		)
		: loc (l)
		, exp (r1)
		, ctx (r2)
		, rank (r)
		, code (c)
		, newcond (cond ? *cond : "")
	{}